

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readline.c
# Opt level: O2

char * mpt_readline(char *prompt)

{
  char cVar1;
  undefined *puVar2;
  char *pcVar3;
  anon_union_8_2_61bd1b83 aVar4;
  ushort **ppuVar5;
  undefined **ppuVar6;
  
  do {
    while( true ) {
      if (mpt_readline::r.fcn != (_func_char_ptr_char_ptr *)0x0) {
        pcVar3 = (*mpt_readline::r.fcn)(prompt);
        aVar4 = mpt_readline::h;
        if (((pcVar3 != (char *)0x0 && mpt_readline::h.fcn != (_func_char_ptr_char_ptr *)0x0) &&
            (cVar1 = *pcVar3, (long)cVar1 != 0)) &&
           (ppuVar5 = __ctype_b_loc(), (*(byte *)((long)*ppuVar5 + (long)cVar1 * 2 + 1) & 0x20) == 0
           )) {
          (*aVar4.fcn)(pcVar3);
        }
        return pcVar3;
      }
      pcVar3 = getenv("MALLOC_TRACE");
      if (pcVar3 != (char *)0x0) {
        fputs("disabled readline support for memory tracing\n",_stderr);
        mpt_readline::h.fcn = (_func_char_ptr_char_ptr *)0x0;
        mpt_readline::r.fcn = _readline;
        pcVar3 = _readline(prompt);
        return pcVar3;
      }
      mpt_readline::r.fcn = (_func_char_ptr_char_ptr *)dlsym(lib_glob,"readline");
      if (mpt_readline::r.fcn == (_func_char_ptr_char_ptr *)0x0) break;
LAB_00101b7f:
      mpt_readline::h.fcn = (_func_char_ptr_char_ptr *)dlsym(lib_glob,"add_history");
    }
    ppuVar6 = &open_backend_backends;
    mpt_readline::r.fcn = (_func_char_ptr_char_ptr *)0x0;
    while (puVar2 = *ppuVar6, puVar2 != (undefined *)0x0) {
      ppuVar6 = ppuVar6 + 1;
      lib_glob = (void *)dlopen(puVar2,1);
      if (lib_glob != (void *)0x0) {
        aVar4.fcn = (_func_char_ptr_char_ptr *)dlsym(lib_glob,"readline");
        if (aVar4.fcn != (_func_char_ptr_char_ptr *)0x0) {
          atexit(close_readline);
          mpt_readline::r.fcn = aVar4.fcn;
          goto LAB_00101b7f;
        }
        dlclose(lib_glob);
      }
    }
    mpt_readline::r.fcn = _readline;
    mpt_readline::h.fcn = (_func_char_ptr_char_ptr *)0x0;
  } while( true );
}

Assistant:

extern char *mpt_readline(const char *prompt)
{
	static union {
		char *(*fcn)(const char *);
		void *addr;
	} r = { 0 }, h;
	
	/* backend already selected */
	if (r.fcn) {
		char *ret = r.fcn(prompt);
		if (h.fcn && ret && *ret && !isspace(*ret)) {
			h.fcn(ret);
		}
		return ret;
	}
	/* no 3rd party allocations */
	if (getenv("MALLOC_TRACE")) {
		fputs("disabled readline support for memory tracing\n", stderr);
		h.addr = 0;
		return (r.fcn = _readline)(prompt);
	}
	/* use linked implementation */
	r.addr = dlsym(lib_glob, "readline");
	
	/* alternate shared lib implementation */
	if (r.addr || (r.addr = open_backend())) {
		h.addr = dlsym(lib_glob, "add_history");
	}
	/* fallback implementation */
	else {
		r.fcn = _readline;
		h.addr = 0;
	}
	/* (re)call with defined backend */
	return mpt_readline(prompt);
}